

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::FenceVkImpl::FenceVkImpl
          (FenceVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVkImpl,FenceDesc *Desc,bool IsDeviceInternal)

{
  DeviceFeatures *pDVar1;
  SemaphoreWrapper local_60;
  VulkanLogicalDevice *local_48;
  VulkanLogicalDevice *LogicalDevice;
  undefined1 local_29;
  FenceDesc *pFStack_28;
  bool IsDeviceInternal_local;
  FenceDesc *Desc_local;
  RenderDeviceVkImpl *pRenderDeviceVkImpl_local;
  IReferenceCounters *pRefCounters_local;
  FenceVkImpl *this_local;
  
  local_29 = IsDeviceInternal;
  pFStack_28 = Desc;
  Desc_local = (FenceDesc *)pRenderDeviceVkImpl;
  pRenderDeviceVkImpl_local = (RenderDeviceVkImpl *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  FenceBase<Diligent::EngineVkImplTraits>::FenceBase
            (&this->super_FenceBase<Diligent::EngineVkImplTraits>,pRefCounters,pRenderDeviceVkImpl,
             Desc,IsDeviceInternal);
  (this->super_FenceBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>.
  super_ObjectBase<Diligent::IFenceVk>.super_RefCountedObject<Diligent::IFenceVk>.super_IFenceVk.
  super_IFence.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_010d0b18;
  VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>::
  VulkanObjectWrapper(&this->m_TimelineSemaphore);
  std::mutex::mutex(&this->m_SyncPointsGuard);
  std::
  deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
  ::deque(&this->m_SyncPoints);
  this->m_MaxSyncPoints = 0;
  if ((this->super_FenceBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>.
      m_Desc.Type == FENCE_TYPE_GENERAL) {
    pDVar1 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetFeatures
                       ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)Desc_local);
    if (pDVar1->NativeFence != DEVICE_FEATURE_STATE_DISABLED) {
      local_48 = RenderDeviceVkImpl::GetLogicalDevice((RenderDeviceVkImpl *)Desc_local);
      VulkanUtilities::VulkanLogicalDevice::CreateTimelineSemaphore
                (&local_60,local_48,0,
                 (this->super_FenceBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                 .m_Desc.super_DeviceObjectAttribs.Name);
      VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>
      ::operator=(&this->m_TimelineSemaphore,&local_60);
      VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>
      ::~VulkanObjectWrapper(&local_60);
    }
  }
  return;
}

Assistant:

FenceVkImpl::FenceVkImpl(IReferenceCounters* pRefCounters,
                         RenderDeviceVkImpl* pRenderDeviceVkImpl,
                         const FenceDesc&    Desc,
                         bool                IsDeviceInternal) :
    // clang-format off
    TFenceBase
    {
        pRefCounters,
        pRenderDeviceVkImpl,
        Desc,
        IsDeviceInternal
    }
// clang-format on
{
    if (m_Desc.Type == FENCE_TYPE_GENERAL &&
        pRenderDeviceVkImpl->GetFeatures().NativeFence)
    {
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice{pRenderDeviceVkImpl->GetLogicalDevice()};
        m_TimelineSemaphore = LogicalDevice.CreateTimelineSemaphore(0, m_Desc.Name);
    }
}